

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::GRULayerParams::SharedCtor(GRULayerParams *this)

{
  *(undefined8 *)((long)&this->inputvectorsize_ + 3) = 0;
  *(undefined8 *)((long)&this->outputvectorsize_ + 3) = 0;
  this->outputgatebiasvector_ = (WeightParams *)0x0;
  this->inputvectorsize_ = 0;
  this->updategatebiasvector_ = (WeightParams *)0x0;
  this->resetgatebiasvector_ = (WeightParams *)0x0;
  this->resetgaterecursionmatrix_ = (WeightParams *)0x0;
  this->outputgaterecursionmatrix_ = (WeightParams *)0x0;
  this->outputgateweightmatrix_ = (WeightParams *)0x0;
  this->updategaterecursionmatrix_ = (WeightParams *)0x0;
  this->updategateweightmatrix_ = (WeightParams *)0x0;
  this->resetgateweightmatrix_ = (WeightParams *)0x0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

void GRULayerParams::SharedCtor() {
  ::memset(&updategateweightmatrix_, 0, reinterpret_cast<char*>(&reverseinput_) -
    reinterpret_cast<char*>(&updategateweightmatrix_) + sizeof(reverseinput_));
  _cached_size_ = 0;
}